

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O2

uint8_t * anon_unknown.dwarf_9bb0::findAttrName(uint8_t *base,uint64_t *len)

{
  byte bVar1;
  uint8_t *puVar2;
  Slice base_00;
  ulong uVar3;
  long lVar4;
  uint8_t *local_10;
  
  bVar1 = *base;
  if ((byte)(bVar1 - 0x40) < 0x7f) {
    *len = (ulong)(bVar1 - 0x40);
    puVar2 = base + 1;
  }
  else if (bVar1 == 0xbf) {
    *len = 0;
    uVar3 = 0;
    lVar4 = 8;
    while (lVar4 != 0) {
      uVar3 = uVar3 << 8 | (ulong)base[lVar4];
      *len = uVar3;
      lVar4 = lVar4 + -1;
    }
    puVar2 = base + 9;
  }
  else {
    local_10 = base;
    base_00 = arangodb::velocypack::
              SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::makeKey
                        ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                         &local_10);
    puVar2 = findAttrName(base_00._start,len);
  }
  return puVar2;
}

Assistant:

uint8_t const* findAttrName(uint8_t const* base, uint64_t& len) {
  uint8_t const b = *base;
  if (b >= 0x40 && b <= 0xbe) {
    // short UTF-8 string
    len = b - 0x40;
    return base + 1;
  }
  if (b == 0xbf) {
    // long UTF-8 string
    len = 0;
    // read string length
    for (std::size_t i = 8; i >= 1; i--) {
      len = (len << 8) + base[i];
    }
    return base + 1 + 8;  // string starts here
  }

  // translate attribute name
  return findAttrName(arangodb::velocypack::Slice(base).makeKey().start(), len);
}